

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * flatbuffers::anon_unknown_1::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool is_upper)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    if (input->_M_string_length <= uVar5) {
      return __return_storage_ptr__;
    }
    pcVar3 = (input->_M_dataplus)._M_p;
    cVar4 = (char)__return_storage_ptr__;
    if (uVar5 == 0) {
      cVar2 = *pcVar3;
      if (cVar2 == '_') {
        std::__cxx11::string::push_back(cVar4);
        if ((1 < input->_M_string_length) &&
           (cVar2 = (input->_M_dataplus)._M_p[1], ((int)cVar2 & 0xffffffdfU) - 0x41 < 0x1a)) {
          CharToUpper(cVar2);
          std::__cxx11::string::push_back(cVar4);
          uVar5 = 1;
          goto LAB_0013ec7d;
        }
      }
      else {
        if (is_upper) {
          CharToUpper(cVar2);
        }
        else {
          CharToLower(cVar2);
        }
        std::__cxx11::string::push_back(cVar4);
      }
      uVar5 = 0;
    }
    else if ((pcVar3[uVar5] == '_') && (uVar1 = uVar5 + 1, uVar1 < input->_M_string_length)) {
      CharToUpper(pcVar3[uVar1]);
      std::__cxx11::string::push_back(cVar4);
      uVar5 = uVar1;
    }
    else {
      std::__cxx11::string::push_back(cVar4);
    }
LAB_0013ec7d:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static std::string ToCamelCase(const std::string &input, bool is_upper) {
  std::string s;
  for (size_t i = 0; i < input.length(); i++) {
    if (!i && input[i] == '_') {
      s += input[i];
      // we ignore leading underscore but make following
      // alphabet char upper.
      if (i + 1 < input.length() && is_alpha(input[i + 1]))
        s += CharToUpper(input[++i]);
    } else if (!i)
      s += is_upper ? CharToUpper(input[i]) : CharToLower(input[i]);
    else if (input[i] == '_' && i + 1 < input.length())
      s += CharToUpper(input[++i]);
    else
      s += input[i];
  }
  return s;
}